

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * closeDirPath(string *__return_storage_ptr__,string *src,char delimiter)

{
  char cVar1;
  
  if (delimiter == ' ') {
    delimiter = getDirSeparator();
  }
  if (((src->_M_string_length == 0) ||
      (cVar1 = (src->_M_dataplus)._M_p[src->_M_string_length - 1], cVar1 == '\\')) || (cVar1 == '/')
     ) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  }
  else {
    std::operator+(__return_storage_ptr__,src,delimiter);
  }
  return __return_storage_ptr__;
}

Assistant:

string closeDirPath(const string& src, char delimiter)
{
    if (delimiter == ' ')
        delimiter = getDirSeparator();
    if (src.length() == 0)
        return src;
    if (src[src.length() - 1] == '/' || src[src.length() - 1] == '\\')
        return src;
    return src + delimiter;
}